

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject.h
# Opt level: O0

shared_ptr<Human> __thiscall
cinject::InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_>::createInstance
          (InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_> *this,
          InjectionContext *context)

{
  ulong uVar1;
  char *pcVar2;
  InjectionContext *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  bool bVar3;
  shared_ptr<Human> sVar4;
  allocator local_99;
  string local_98 [32];
  component_type local_78;
  undefined1 local_50 [8];
  ContextGuard guard;
  InjectionContext *context_local;
  InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_> *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  bVar3 = (uVar1 & 1) != 0;
  if (bVar3) {
    pcVar2 = type_name<Human,_void>::value();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,pcVar2,&local_99);
  }
  else {
    std::__cxx11::string::string(local_98,(string *)(context + 1));
  }
  make_component_type<Human>(&local_78,(string *)local_98);
  ContextGuard::ContextGuard((ContextGuard *)local_50,in_RDX,&local_78);
  component_type::~component_type(&local_78);
  std::__cxx11::string::~string(local_98);
  if (bVar3) {
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
  }
  ContextGuard::ensureNoCycle((ContextGuard *)local_50);
  ConstructorFactory<Human,_void>::createInstance
            ((ConstructorFactory<Human,_void> *)this,(InjectionContext *)&context->componentStack_);
  ContextGuard::~ContextGuard((ContextGuard *)local_50);
  sVar4.super___shared_ptr<Human,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar4.super___shared_ptr<Human,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Human>)sVar4.super___shared_ptr<Human,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TImplementation> createInstance(InjectionContext* context)
    {
        ContextGuard guard(context, make_component_type<TImplementation>(!name_.empty() ? name_ : type_name<TImplementation>::value()));

        guard.ensureNoCycle();

        return factory_.createInstance(context);
    }